

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O0

bool absl::GenericCompare<bool,absl::Cord>(Cord *lhs,Cord *rhs,size_t size_to_compare)

{
  int memcmp_res_00;
  unsigned_long *puVar1;
  const_pointer __s1;
  const_pointer __s2;
  int local_68;
  size_type sStack_60;
  int memcmp_res;
  size_type local_58;
  ulong local_50;
  size_t compared_size;
  string_view rhs_chunk;
  string_view lhs_chunk;
  size_t size_to_compare_local;
  Cord *rhs_local;
  Cord *lhs_local;
  
  join_0x00000010_0x00000000_ = Cord::GetFirstChunk(lhs);
  _compared_size = Cord::GetFirstChunk(rhs);
  local_58 = std::basic_string_view<char,_std::char_traits<char>_>::size
                       ((basic_string_view<char,_std::char_traits<char>_> *)&rhs_chunk._M_str);
  sStack_60 = std::basic_string_view<char,_std::char_traits<char>_>::size
                        ((basic_string_view<char,_std::char_traits<char>_> *)&compared_size);
  puVar1 = std::min<unsigned_long>(&local_58,&stack0xffffffffffffffa0);
  local_50 = *puVar1;
  if (local_50 <= size_to_compare) {
    if (local_50 == 0) {
      local_68 = 0;
    }
    else {
      __s1 = std::basic_string_view<char,_std::char_traits<char>_>::data
                       ((basic_string_view<char,_std::char_traits<char>_> *)&rhs_chunk._M_str);
      __s2 = std::basic_string_view<char,_std::char_traits<char>_>::data
                       ((basic_string_view<char,_std::char_traits<char>_> *)&compared_size);
      local_68 = memcmp(__s1,__s2,local_50);
    }
    if ((local_50 == size_to_compare) || (local_68 != 0)) {
      lhs_local._7_1_ = anon_unknown_37::ComputeCompareResult<bool>(local_68);
    }
    else {
      memcmp_res_00 = Cord::CompareSlowPath(lhs,rhs,local_50,size_to_compare);
      lhs_local._7_1_ = anon_unknown_37::ComputeCompareResult<bool>(memcmp_res_00);
    }
    return lhs_local._7_1_;
  }
  __assert_fail("size_to_compare >= compared_size",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O0/_deps/abseil-cpp-src/absl/strings/cord.cc"
                ,0x3d1,
                "ResultType absl::GenericCompare(const Cord &, const RHS &, size_t) [ResultType = bool, RHS = absl::Cord]"
               );
}

Assistant:

ResultType GenericCompare(const Cord& lhs, const RHS& rhs,
                          size_t size_to_compare) {
  absl::string_view lhs_chunk = Cord::GetFirstChunk(lhs);
  absl::string_view rhs_chunk = Cord::GetFirstChunk(rhs);

  size_t compared_size = std::min(lhs_chunk.size(), rhs_chunk.size());
  assert(size_to_compare >= compared_size);
  int memcmp_res = compared_size > 0 ? ::memcmp(lhs_chunk.data(),
                                                rhs_chunk.data(), compared_size)
                                     : 0;
  if (compared_size == size_to_compare || memcmp_res != 0) {
    return ComputeCompareResult<ResultType>(memcmp_res);
  }

  return ComputeCompareResult<ResultType>(
      lhs.CompareSlowPath(rhs, compared_size, size_to_compare));
}